

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O3

int __thiscall StatisticsApp::run(StatisticsApp *this)

{
  size_type sVar1;
  byte bVar2;
  pointer pcVar3;
  ulong *puVar4;
  ostream *stream;
  uint uVar5;
  pointer pbVar6;
  char cVar7;
  bool bVar8;
  int iVar9;
  ostream *poVar10;
  ostream *extraout_RAX;
  ostream *extraout_RAX_00;
  ostream *extraout_RAX_01;
  ostream *extraout_RAX_02;
  undefined8 *puVar11;
  ostream *extraout_RAX_03;
  ostream *extraout_RAX_04;
  ostream *extraout_RAX_05;
  ostream *extraout_RAX_06;
  ostream *extraout_RAX_07;
  ulong *puVar12;
  ostream *extraout_RAX_08;
  ostream *extraout_RAX_09;
  ostream *extraout_RAX_10;
  ostream *extraout_RAX_11;
  pointer pDVar13;
  ostream *extraout_RAX_12;
  ostream *extraout_RAX_13;
  ostream *extraout_RAX_14;
  long lVar14;
  ostream *extraout_RAX_15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  istream *extraout_RDX;
  istream *extraout_RDX_00;
  istream *extraout_RDX_01;
  istream *extraout_RDX_02;
  istream *extraout_RDX_03;
  istream *extraout_RDX_04;
  istream *extraout_RDX_05;
  istream *extraout_RDX_06;
  istream *extraout_RDX_07;
  istream *extraout_RDX_08;
  istream *extraout_RDX_09;
  istream *extraout_RDX_10;
  istream *piVar16;
  istream *extraout_RDX_11;
  istream *extraout_RDX_12;
  istream *extraout_RDX_13;
  istream *extraout_RDX_14;
  size_type sVar17;
  char *pcVar18;
  uint uVar19;
  undefined8 *puVar20;
  long lVar21;
  long lVar22;
  StatisticsApp *this_00;
  ulong uVar23;
  double dVar24;
  double __x;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int iVar30;
  int iVar31;
  undefined1 auVar27 [16];
  int iVar32;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  int iVar52;
  int iVar56;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 in_XMM6 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar57 [16];
  double d;
  string lineToReshape;
  string line;
  DataVector data;
  StringSplitter parser;
  StatisticsWriter writer;
  DataVector dataMasked;
  stringstream msg;
  RowSampler sampler;
  ifstream fileInput;
  undefined1 local_598 [16];
  undefined1 local_588 [32];
  ulong local_568;
  long local_560 [2];
  uint local_54c;
  StatisticsApp *local_548;
  int local_53c;
  string local_538;
  int local_514;
  istream *local_510;
  vector<DataPoint,_std::allocator<DataPoint>_> local_508;
  undefined1 local_4e8 [16];
  pointer local_4d8;
  undefined1 local_4c8 [16];
  pointer local_4b8;
  vector<bool,_std::allocator<bool>_> *local_4b0;
  StatisticsWriter local_4a8;
  undefined1 local_488 [16];
  pointer local_478;
  undefined1 local_468 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  _Bit_pointer local_448;
  uint auStack_440 [22];
  ios_base local_3e8 [264];
  DataFilters *local_2e0;
  string *local_2d8;
  string local_2d0;
  istream *local_2b0;
  ulong local_2a8;
  MultivariateTracker *local_2a0;
  istream *local_298;
  long *local_290;
  long local_288;
  long local_280 [2];
  RowSampler local_26c;
  long *local_258 [2];
  long local_248 [2];
  long local_238;
  
  this_00 = (StatisticsApp *)&stack0xfffffffffffffdc8;
  std::ifstream::ifstream((ifstream *)this_00,(this->_options).fileInput._M_dataplus._M_p,_S_in);
  iVar9 = *(int *)(&stack0xfffffffffffffde8 + *(long *)(local_238 + -0x18));
  if (iVar9 != 0) {
    this_00 = (StatisticsApp *)&std::cin;
  }
  if (2 < (int)Logger::logLevel) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_468);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_458._M_local_buf,
                         ApplicationProperties::NAME_abi_cxx11_._M_dataplus._M_p,
                         ApplicationProperties::NAME_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," is starting",0xc);
    cVar7 = std::ios::widen((ios *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18)),'\n');
    poVar10 = (ostream *)std::ostream::put(poVar10,cVar7);
    dVar24 = (double)std::ostream::flush(poVar10);
    Logger::log(dVar24);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              (extraout_RAX,local_4a8._comment._M_dataplus._M_p,local_4a8._comment._M_string_length)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._comment._M_dataplus._M_p != &local_4a8._comment.field_2) {
      operator_delete(local_4a8._comment._M_dataplus._M_p,
                      local_4a8._comment.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_468);
    std::ios_base::~ios_base(local_3e8);
  }
  local_290 = local_280;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"#","");
  local_4a8._comment._M_dataplus._M_p = (pointer)&local_4a8._comment.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4a8,local_290,local_288 + (long)local_290);
  if (local_290 != local_280) {
    operator_delete(local_290,local_280[0] + 1);
  }
  local_26c._count = 0;
  local_26c._next = 1;
  local_26c._mode = (this->_options).sampling.mode;
  local_26c._sampled = 0;
  local_26c._step = (this->_options).sampling.step;
  uVar19 = 0;
  local_4d8 = (pointer)0x0;
  local_4e8._0_8_ = (_Bit_type *)0x0;
  local_4e8._8_4_ = 0;
  local_4e8._12_4_ = 0;
  local_4b8 = (pointer)0x0;
  local_4c8 = (undefined1  [16])0x0;
  local_588._24_8_ = local_560;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_588 + 0x18),"");
  local_508.super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_508.super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_508.super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_478 = (pointer)0x0;
  local_488 = (undefined1  [16])0x0;
  if (iVar9 == 0) {
    puVar20 = &stack0xfffffffffffffdc8;
  }
  else {
    puVar20 = &std::cin;
  }
  local_588._16_8_ = local_3e8;
  local_2d8 = &(this->_options).delimiter;
  local_4b0 = &(this->_options).filterColumns;
  local_2e0 = &(this->_options).filterRows;
  local_2a0 = &this->_tracker;
  local_54c = 0;
  local_53c = 0;
  local_514 = 0;
  piVar16 = extraout_RDX;
  local_548 = this;
  do {
    readline_abi_cxx11_(&local_538,this_00,piVar16);
    piVar16 = extraout_RDX_00;
    if (*(int *)((long)puVar20 + *(long *)(*(long *)&this_00->_options + -0x18) + 0x20) == 0) {
      if (local_538._M_string_length == 0) {
        if ((local_548->_options).blankEOF == true) {
          bVar8 = true;
          if (4 < (int)Logger::logLevel) {
            std::__cxx11::stringstream::stringstream((stringstream *)local_468);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_458._M_local_buf,"Blank line found. Exiting.",0x1a);
            cVar7 = std::ios::widen((ios *)((long)&local_458 +
                                           *(long *)(local_458._M_allocated_capacity - 0x18)),'\n');
            poVar10 = (ostream *)std::ostream::put((ostream *)local_458._M_local_buf,cVar7);
            dVar24 = (double)std::ostream::flush(poVar10);
            Logger::log(dVar24);
            std::__cxx11::stringbuf::str();
            std::__ostream_insert<char,std::char_traits<char>>
                      (extraout_RAX_01,(char *)local_598._0_8_,local_598._8_8_);
            goto LAB_0017d532;
          }
          goto LAB_0017daac;
        }
        if (4 < (int)Logger::logLevel) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_468);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_458._M_local_buf,"Blank line found. Skipping.",0x1b);
          cVar7 = std::ios::widen((ios *)((long)&local_458 +
                                         *(long *)(local_458._M_allocated_capacity - 0x18)),'\n');
          poVar10 = (ostream *)std::ostream::put((ostream *)local_458._M_local_buf,cVar7);
          dVar24 = (double)std::ostream::flush(poVar10);
          Logger::log(dVar24);
          std::__cxx11::stringbuf::str();
          std::__ostream_insert<char,std::char_traits<char>>
                    (extraout_RAX_02,(char *)local_598._0_8_,local_598._8_8_);
          if ((pointer)local_598._0_8_ != (pointer)local_588) {
            operator_delete((void *)local_598._0_8_,(ulong)(local_588._0_8_ + 1));
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_468);
          std::ios_base::~ios_base((ios_base *)local_588._16_8_);
          piVar16 = extraout_RDX_03;
        }
      }
      else {
        iVar9 = std::__cxx11::string::compare
                          ((string *)&local_538,0,1,(local_548->_options).comment._M_dataplus._M_p);
        piVar16 = extraout_RDX_02;
        if (iVar9 != 0) {
          local_598._0_8_ = local_588;
          if (uVar19 == 0) {
            std::__cxx11::string::_M_construct<char_const*>((string *)local_598,"");
          }
          else {
            pcVar3 = (local_548->_options).delimiter._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_598,pcVar3,
                       pcVar3 + (local_548->_options).delimiter._M_string_length);
          }
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((string *)local_598,local_538._M_dataplus._M_p,
                               local_538._M_string_length);
          paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 == paVar15) {
            local_458 = *paVar15;
            local_468._0_8_ = &local_458;
          }
          else {
            local_458._M_allocated_capacity = paVar15->_M_allocated_capacity;
            local_468._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar11;
          }
          local_468._8_8_ = puVar11[1];
          *puVar11 = paVar15;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          std::__cxx11::string::_M_append
                    ((string *)(local_588 + 0x18),(char *)local_468._0_8_,local_468._8_8_);
          piVar16 = extraout_RDX_04;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._0_8_ != &local_458) {
            operator_delete((void *)local_468._0_8_,local_458._M_allocated_capacity + 1);
            piVar16 = extraout_RDX_05;
          }
          if ((pointer)local_598._0_8_ != (pointer)local_588) {
            operator_delete((void *)local_598._0_8_,(ulong)(local_588._0_8_ + 1));
            piVar16 = extraout_RDX_06;
          }
          uVar19 = uVar19 + 1;
          if ((local_548->_options).numLinesToReshape <= uVar19) {
            std::__cxx11::string::_M_assign((string *)&local_538,(string *)(local_588 + 0x18));
            std::__cxx11::string::_M_replace((string *)(local_588 + 0x18),0,local_568,"",0);
            local_54c = local_54c + 1;
            piVar16 = (istream *)(ulong)local_54c;
            if ((local_548->_options).headerRow == local_54c) {
              StringSplitter::initialize
                        ((StringSplitter *)local_4c8,&local_538,local_2d8,
                         (local_548->_options).removeDuplicates,local_4b0);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_598,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_4c8);
              pbVar6 = local_4d8;
              local_468 = local_4e8;
              local_4d8 = (pointer)local_588._0_8_;
              local_4e8 = local_598;
              local_458._M_allocated_capacity = (size_type)pbVar6;
              local_598._0_8_ = (_Bit_type *)0x0;
              local_598._8_4_ = 0;
              local_598._12_4_ = 0;
              local_588._0_8_ = (pointer)0x0;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_468);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_598);
              piVar16 = extraout_RDX_07;
            }
            else {
              uVar19 = (local_548->_options).numLinesToSkip;
              if (uVar19 < local_54c) {
                if (uVar19 + (local_548->_options).numLinesToKeep < local_54c) {
                  uVar19 = 0;
                  bVar8 = true;
                  if (2 < (int)Logger::logLevel) {
                    std::__cxx11::stringstream::stringstream((stringstream *)local_468);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_458._M_local_buf,"Skipping remaining lines.",0x19);
                    cVar7 = std::ios::widen((ios *)((long)&local_458 +
                                                   *(long *)(local_458._M_allocated_capacity - 0x18)
                                                   ),'\n');
                    poVar10 = (ostream *)std::ostream::put((ostream *)local_458._M_local_buf,cVar7);
                    dVar24 = (double)std::ostream::flush(poVar10);
                    Logger::log(dVar24);
                    std::__cxx11::stringbuf::str();
                    std::__ostream_insert<char,std::char_traits<char>>
                              (extraout_RAX_03,(char *)local_598._0_8_,local_598._8_8_);
                    goto LAB_0017d532;
                  }
                  goto LAB_0017daac;
                }
                bVar8 = RowSampler::sample(&local_26c);
                if (bVar8) {
                  local_458 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               )0x0;
                  local_468._0_8_ = (_Bit_type *)0x0;
                  local_468._8_4_ = 0;
                  local_468._12_4_ = 0;
                  local_448 = (_Bit_pointer)0x0;
                  StringSplitter::initialize
                            ((StringSplitter *)local_4c8,&local_538,local_2d8,
                             (local_548->_options).removeDuplicates,
                             (vector<bool,_std::allocator<bool>_> *)local_468);
                  if ((pointer)local_468._0_8_ != (pointer)0x0) {
                    operator_delete((void *)local_468._0_8_,(long)local_448 - local_468._0_8_);
                  }
                  uVar23 = local_4c8._8_8_ - local_4c8._0_8_;
                  if (4 < (int)Logger::logLevel) {
                    std::__cxx11::stringstream::stringstream((stringstream *)local_468);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_458._M_local_buf,"Line = ",7);
                    poVar10 = std::ostream::_M_insert<unsigned_long>
                                        ((ostream *)local_458._M_local_buf,(ulong)local_54c);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar10," - content =\"",0xd)
                    ;
                    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar10,local_538._M_dataplus._M_p,
                                         local_538._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"",1);
                    cVar7 = std::ios::widen((ios *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18)),
                                            '\n');
                    poVar10 = (ostream *)std::ostream::put(poVar10,cVar7);
                    dVar24 = (double)std::ostream::flush(poVar10);
                    Logger::log(dVar24);
                    std::__cxx11::stringbuf::str();
                    std::__ostream_insert<char,std::char_traits<char>>
                              (extraout_RAX_05,(char *)local_598._0_8_,local_598._8_8_);
                    if ((pointer)local_598._0_8_ != (pointer)local_588) {
                      operator_delete((void *)local_598._0_8_,(ulong)(local_588._0_8_ + 1));
                    }
                    std::__cxx11::stringstream::~stringstream((stringstream *)local_468);
                    std::ios_base::~ios_base((ios_base *)local_588._16_8_);
                  }
                  piVar16 = (istream *)((long)uVar23 >> 5);
                  local_510 = piVar16;
                  if (local_514 < 1) {
                    sVar17 = (size_type)(int)(uVar23 >> 5);
                    std::vector<DataPoint,_std::allocator<DataPoint>_>::resize(&local_508,sVar17);
                    std::vector<bool,_std::allocator<bool>_>::resize
                              (local_4b0,sVar17,
                               ((long)(local_548->_options).filterColumns.
                                      super__Bvector_base<std::allocator<bool>_>._M_impl.
                                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                      _M_p -
                               (long)(local_548->_options).filterColumns.
                                     super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                               ) * 8 + (ulong)*(uint *)((long)&(local_548->_options).filterColumns.
                                                                                                                              
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_finish.
                                                  super__Bit_iterator_base + 8) == 0);
                    puVar12 = (local_548->_options).filterColumns.
                              super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                    puVar4 = (local_548->_options).filterColumns.
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
                    uVar19 = *(uint *)((long)&(local_548->_options).filterColumns.
                                              super__Bvector_base<std::allocator<bool>_>._M_impl.
                                              super__Bvector_impl_data._M_finish.
                                              super__Bit_iterator_base + 8);
                    local_53c = 0;
                    if (uVar19 != 0 || puVar12 != puVar4) {
                      local_53c = 0;
                      uVar23 = 0;
                      do {
                        local_53c = local_53c + (uint)((*puVar12 >> (uVar23 & 0x3f) & 1) != 0);
                        iVar9 = (int)uVar23;
                        puVar12 = puVar12 + (iVar9 == 0x3f);
                        uVar5 = iVar9 + 1;
                        if (iVar9 == 0x3f) {
                          uVar5 = 0;
                        }
                        uVar23 = (ulong)uVar5;
                      } while (uVar5 != uVar19 || puVar12 != puVar4);
                    }
                    std::vector<DataPoint,_std::allocator<DataPoint>_>::resize
                              ((vector<DataPoint,_std::allocator<DataPoint>_> *)local_488,
                               (long)local_53c);
                    uVar19 = local_54c;
                    if (2 < (int)Logger::logLevel) {
                      std::__cxx11::stringstream::stringstream((stringstream *)local_468);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_458._M_local_buf,"Data dimensions set to ",0x17);
                      poVar10 = (ostream *)
                                std::ostream::operator<<
                                          ((ostream *)local_458._M_local_buf,(int)local_510);
                      cVar7 = std::ios::widen((ios *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18))
                                              ,'\n');
                      poVar10 = (ostream *)std::ostream::put(poVar10,cVar7);
                      dVar24 = (double)std::ostream::flush(poVar10);
                      Logger::log(dVar24);
                      std::__cxx11::stringbuf::str();
                      std::__ostream_insert<char,std::char_traits<char>>
                                (extraout_RAX_08,(char *)local_598._0_8_,local_598._8_8_);
                      if ((pointer)local_598._0_8_ != (pointer)local_588) {
                        operator_delete((void *)local_598._0_8_,(ulong)(local_588._0_8_ + 1));
                      }
                      std::__cxx11::stringstream::~stringstream((stringstream *)local_468);
                      std::ios_base::~ios_base((ios_base *)local_588._16_8_);
                      if (2 < (int)Logger::logLevel) {
                        std::__cxx11::stringstream::stringstream((stringstream *)local_468);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_458._M_local_buf,"Mask dimensions set to ",0x17)
                        ;
                        poVar10 = (ostream *)
                                  std::ostream::operator<<
                                            ((ostream *)local_458._M_local_buf,local_53c);
                        cVar7 = std::ios::widen((ios *)(poVar10 +
                                                       *(long *)(*(long *)poVar10 + -0x18)),'\n');
                        poVar10 = (ostream *)std::ostream::put(poVar10,cVar7);
                        dVar24 = (double)std::ostream::flush(poVar10);
                        Logger::log(dVar24);
                        std::__cxx11::stringbuf::str();
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (extraout_RAX_09,(char *)local_598._0_8_,local_598._8_8_);
                        if ((pointer)local_598._0_8_ != (pointer)local_588) {
                          operator_delete((void *)local_598._0_8_,(ulong)(local_588._0_8_ + 1));
                        }
                        std::__cxx11::stringstream::~stringstream((stringstream *)local_468);
                        std::ios_base::~ios_base((ios_base *)local_588._16_8_);
                      }
                    }
                    local_514 = (int)local_510;
                  }
                  else {
                    uVar19 = local_54c;
                    if (local_514 != (int)piVar16) {
                      if (1 < (int)Logger::logLevel) {
                        std::__cxx11::stringstream::stringstream((stringstream *)local_468);
                        uVar19 = local_54c;
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_458._M_local_buf,"Line = ",7);
                        poVar10 = std::ostream::_M_insert<unsigned_long>
                                            ((ostream *)local_458._M_local_buf,(ulong)uVar19);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10,
                                   " - Statistics dimensions does not equal data dimensions.",0x38);
                        bVar8 = (local_548->_options).strictParsing != false;
                        pcVar18 = "";
                        if (bVar8) {
                          pcVar18 = " Skipping.";
                        }
                        lVar22 = 0;
                        if (bVar8) {
                          lVar22 = 10;
                        }
                        std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar18,lVar22);
                        cVar7 = std::ios::widen((ios *)(poVar10 +
                                                       *(long *)(*(long *)poVar10 + -0x18)),'\n');
                        poVar10 = (ostream *)std::ostream::put(poVar10,cVar7);
                        dVar24 = (double)std::ostream::flush(poVar10);
                        Logger::log(dVar24);
                        std::__cxx11::stringbuf::str();
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (extraout_RAX_06,(char *)local_598._0_8_,local_598._8_8_);
                        if ((pointer)local_598._0_8_ != (pointer)local_588) {
                          operator_delete((void *)local_598._0_8_,(ulong)(local_588._0_8_ + 1));
                        }
                        std::__cxx11::stringstream::~stringstream((stringstream *)local_468);
                        std::ios_base::~ios_base((ios_base *)local_588._16_8_);
                        piVar16 = extraout_RDX_11;
                      }
                      uVar19 = local_54c;
                      if ((local_548->_options).strictParsing != false) goto LAB_0017daa9;
                    }
                  }
                  if (3 < (int)Logger::logLevel) {
                    std::__cxx11::stringstream::stringstream((stringstream *)local_468);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_458._M_local_buf,"Line = ",7);
                    poVar10 = std::ostream::_M_insert<unsigned_long>
                                        ((ostream *)local_458._M_local_buf,(ulong)uVar19);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10," - Number of tokens found: ",0x1b);
                    poVar10 = std::ostream::_M_insert<unsigned_long>(poVar10,(ulong)local_510);
                    cVar7 = std::ios::widen((ios *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18)),
                                            '\n');
                    poVar10 = (ostream *)std::ostream::put(poVar10,cVar7);
                    dVar24 = (double)std::ostream::flush(poVar10);
                    Logger::log(dVar24);
                    std::__cxx11::stringbuf::str();
                    std::__ostream_insert<char,std::char_traits<char>>
                              (extraout_RAX_10,(char *)local_598._0_8_,local_598._8_8_);
                    if ((pointer)local_598._0_8_ != (pointer)local_588) {
                      operator_delete((void *)local_598._0_8_,(ulong)(local_588._0_8_ + 1));
                    }
                    std::__cxx11::stringstream::~stringstream((stringstream *)local_468);
                    std::ios_base::~ios_base((ios_base *)local_588._16_8_);
                  }
                  bVar8 = DataFilters::isFiltered
                                    (local_2e0,
                                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_4c8);
                  if (bVar8) {
                    local_2b0 = (istream *)(long)local_514;
                    if (local_2b0 < local_510) {
                      local_510 = local_2b0;
                    }
                    if (local_510 != (istream *)0x0) {
                      local_2a8 = (ulong)local_54c;
                      lVar22 = 8;
                      piVar16 = (istream *)0x0;
                      do {
                        if ((istream *)
                            ((long)local_508.
                                   super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl
                                   .super__Vector_impl_data._M_finish -
                             (long)local_508.
                                   super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl
                                   .super__Vector_impl_data._M_start >> 4) <= piVar16) {
LAB_0017f10f:
                          std::__throw_out_of_range_fmt
                                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                     ,piVar16);
                        }
                        bVar8 = StringSplitter::toValue<double>
                                          ((StringSplitter *)local_4c8,(size_type)piVar16,
                                           (double *)
                                           (&(local_508.
                                              super__Vector_base<DataPoint,_std::allocator<DataPoint>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->active +
                                           lVar22));
                        if ((istream *)
                            ((long)local_508.
                                   super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl
                                   .super__Vector_impl_data._M_finish -
                             (long)local_508.
                                   super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl
                                   .super__Vector_impl_data._M_start >> 4) <= piVar16)
                        goto LAB_0017f10f;
                        *(bool *)((long)local_508.
                                        super__Vector_base<DataPoint,_std::allocator<DataPoint>_>.
                                        _M_impl.super__Vector_impl_data._M_start + lVar22 + -8) =
                             bVar8;
                        if (4 < (int)Logger::logLevel) {
                          std::__cxx11::stringstream::stringstream((stringstream *)local_468);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_458._M_local_buf,"Line = ",7);
                          poVar10 = std::ostream::_M_insert<unsigned_long>
                                              ((ostream *)local_458._M_local_buf,local_2a8);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar10," - ",3);
                          if ((istream *)
                              ((long)local_508.
                                     super__Vector_base<DataPoint,_std::allocator<DataPoint>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)local_508.
                                     super__Vector_base<DataPoint,_std::allocator<DataPoint>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 4) <= piVar16) {
LAB_0017f125:
                            std::__throw_out_of_range_fmt
                                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                       ,piVar16);
                          }
                          bVar2 = *(byte *)((long)local_508.
                                                  super__Vector_base<DataPoint,_std::allocator<DataPoint>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                           lVar22 + -8);
                          pcVar18 = "Invalid token";
                          if (bVar2 != 0) {
                            pcVar18 = "Valid token";
                          }
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,pcVar18,(ulong)(bVar2 ^ 1) * 2 + 0xb);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar10," = ",3);
                          if ((istream *)((long)(local_4c8._8_8_ - local_4c8._0_8_) >> 5) <= piVar16
                             ) goto LAB_0017f125;
                          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar10,*(char **)(local_4c8._0_8_ +
                                                                 lVar22 * 2 + -0x10),
                                               *(long *)(local_4c8._0_8_ + lVar22 * 2 + -8));
                          cVar7 = std::ios::widen((ios *)(poVar10 +
                                                         *(long *)(*(long *)poVar10 + -0x18)),'\n');
                          poVar10 = (ostream *)std::ostream::put(poVar10,cVar7);
                          dVar24 = (double)std::ostream::flush(poVar10);
                          Logger::log(dVar24);
                          std::__cxx11::stringbuf::str();
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (extraout_RAX_11,(char *)local_598._0_8_,local_598._8_8_);
                          if ((pointer)local_598._0_8_ != (pointer)local_588) {
                            operator_delete((void *)local_598._0_8_,(ulong)(local_588._0_8_ + 1));
                          }
                          std::__cxx11::stringstream::~stringstream((stringstream *)local_468);
                          std::ios_base::~ios_base((ios_base *)local_588._16_8_);
                        }
                        piVar16 = piVar16 + 1;
                        lVar22 = lVar22 + 0x10;
                      } while (local_510 != piVar16);
                    }
                    bVar8 = DataFilters::isFiltered(local_2e0,(DataVector *)&local_508);
                    if (bVar8) {
                      local_468._0_8_ = local_2b0;
                      local_598._0_8_ = (_Bit_type *)(long)local_53c;
                      local_298 = local_2b0;
                      DataVector::copy((EVP_PKEY_CTX *)&local_508,(EVP_PKEY_CTX *)local_468);
                      if ((local_548->_options).showFilteredData == true) {
                        stream = local_548->_outputStream;
                        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
                        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0," ","")
                        ;
                        StatisticsWriter::writeData
                                  (&local_4a8,stream,(DataVector *)local_488,&local_2d0);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                          operator_delete(local_2d0._M_dataplus._M_p,
                                          local_2d0.field_2._M_allocated_capacity + 1);
                        }
                      }
                      MultivariateTracker::update(local_2a0,(DataVector *)local_488);
                      piVar16 = extraout_RDX_14;
                      if (local_508.super__Vector_base<DataPoint,_std::allocator<DataPoint>_>.
                          _M_impl.super__Vector_impl_data._M_start !=
                          local_508.super__Vector_base<DataPoint,_std::allocator<DataPoint>_>.
                          _M_impl.super__Vector_impl_data._M_finish) {
                        uVar23 = (long)local_508.
                                       super__Vector_base<DataPoint,_std::allocator<DataPoint>_>.
                                       _M_impl.super__Vector_impl_data._M_finish +
                                 (-0x10 - (long)local_508.
                                                super__Vector_base<DataPoint,_std::allocator<DataPoint>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        auVar27._8_4_ = (int)uVar23;
                        auVar27._0_8_ = uVar23;
                        auVar27._12_4_ = (int)(uVar23 >> 0x20);
                        auVar25._0_8_ = uVar23 >> 4;
                        auVar25._8_8_ = auVar27._8_8_ >> 4;
                        pDVar13 = local_508.
                                  super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
                                  super__Vector_impl_data._M_start + 0xf;
                        piVar16 = (istream *)0x0;
                        do {
                          auVar29._8_4_ = (int)piVar16;
                          auVar29._0_8_ = piVar16;
                          auVar29._12_4_ = (int)((ulong)piVar16 >> 0x20);
                          auVar27 = auVar25 ^ _DAT_0023b0a0;
                          auVar33 = (auVar29 | _DAT_0023b090) ^ _DAT_0023b0a0;
                          iVar9 = auVar27._0_4_;
                          iVar52 = -(uint)(iVar9 < auVar33._0_4_);
                          iVar30 = auVar27._4_4_;
                          auVar34._4_4_ = -(uint)(iVar30 < auVar33._4_4_);
                          iVar31 = auVar27._8_4_;
                          iVar56 = -(uint)(iVar31 < auVar33._8_4_);
                          iVar32 = auVar27._12_4_;
                          auVar34._12_4_ = -(uint)(iVar32 < auVar33._12_4_);
                          auVar45._4_4_ = iVar52;
                          auVar45._0_4_ = iVar52;
                          auVar45._8_4_ = iVar56;
                          auVar45._12_4_ = iVar56;
                          auVar27 = pshuflw(in_XMM6,auVar45,0xe8);
                          auVar43._4_4_ = -(uint)(auVar33._4_4_ == iVar30);
                          auVar43._12_4_ = -(uint)(auVar33._12_4_ == iVar32);
                          auVar43._0_4_ = auVar43._4_4_;
                          auVar43._8_4_ = auVar43._12_4_;
                          auVar57 = pshuflw(in_XMM7,auVar43,0xe8);
                          auVar34._0_4_ = auVar34._4_4_;
                          auVar34._8_4_ = auVar34._12_4_;
                          auVar33 = pshuflw(auVar27,auVar34,0xe8);
                          auVar33 = (auVar33 | auVar57 & auVar27) ^ _DAT_0023b0c0;
                          auVar33 = packssdw(auVar33,auVar33);
                          if ((auVar33 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                            pDVar13[-0xf].active = false;
                          }
                          auVar34 = auVar43 & auVar45 | auVar34;
                          auVar33 = packssdw(auVar34,auVar34);
                          auVar33 = packssdw(auVar33 ^ _DAT_0023b0c0,auVar33 ^ _DAT_0023b0c0);
                          auVar33 = packsswb(auVar33,auVar33);
                          if ((auVar33._0_4_ >> 8 & 1) != 0) {
                            pDVar13[-0xe].active = false;
                          }
                          auVar43 = (auVar29 | _DAT_0023b080) ^ _DAT_0023b0a0;
                          iVar52 = -(uint)(iVar9 < auVar43._0_4_);
                          auVar53._4_4_ = -(uint)(iVar30 < auVar43._4_4_);
                          iVar56 = -(uint)(iVar31 < auVar43._8_4_);
                          auVar53._12_4_ = -(uint)(iVar32 < auVar43._12_4_);
                          auVar33._4_4_ = iVar52;
                          auVar33._0_4_ = iVar52;
                          auVar33._8_4_ = iVar56;
                          auVar33._12_4_ = iVar56;
                          auVar44._4_4_ = -(uint)(auVar43._4_4_ == iVar30);
                          auVar44._12_4_ = -(uint)(auVar43._12_4_ == iVar32);
                          auVar44._0_4_ = auVar44._4_4_;
                          auVar44._8_4_ = auVar44._12_4_;
                          auVar53._0_4_ = auVar53._4_4_;
                          auVar53._8_4_ = auVar53._12_4_;
                          auVar43 = auVar44 & auVar33 | auVar53;
                          auVar43 = packssdw(auVar43,auVar43);
                          auVar43 = packssdw(auVar43 ^ _DAT_0023b0c0,auVar43 ^ _DAT_0023b0c0);
                          auVar43 = packsswb(auVar43,auVar43);
                          if ((auVar43._0_4_ >> 0x10 & 1) != 0) {
                            pDVar13[-0xd].active = false;
                          }
                          auVar33 = pshufhw(auVar33,auVar33,0x84);
                          auVar45 = pshufhw(auVar44,auVar44,0x84);
                          auVar34 = pshufhw(auVar33,auVar53,0x84);
                          auVar33 = (auVar34 | auVar45 & auVar33) ^ _DAT_0023b0c0;
                          auVar33 = packssdw(auVar33,auVar33);
                          auVar33 = packsswb(auVar33,auVar33);
                          if ((auVar33._0_4_ >> 0x18 & 1) != 0) {
                            pDVar13[-0xc].active = false;
                          }
                          auVar33 = (auVar29 | _DAT_0023b070) ^ _DAT_0023b0a0;
                          iVar52 = -(uint)(iVar9 < auVar33._0_4_);
                          auVar36._4_4_ = -(uint)(iVar30 < auVar33._4_4_);
                          iVar56 = -(uint)(iVar31 < auVar33._8_4_);
                          auVar36._12_4_ = -(uint)(iVar32 < auVar33._12_4_);
                          auVar46._4_4_ = iVar52;
                          auVar46._0_4_ = iVar52;
                          auVar46._8_4_ = iVar56;
                          auVar46._12_4_ = iVar56;
                          auVar43 = pshuflw(auVar43,auVar46,0xe8);
                          auVar35._4_4_ = -(uint)(auVar33._4_4_ == iVar30);
                          auVar35._12_4_ = -(uint)(auVar33._12_4_ == iVar32);
                          auVar35._0_4_ = auVar35._4_4_;
                          auVar35._8_4_ = auVar35._12_4_;
                          auVar33 = pshuflw(auVar57 & auVar27,auVar35,0xe8);
                          auVar36._0_4_ = auVar36._4_4_;
                          auVar36._8_4_ = auVar36._12_4_;
                          auVar27 = pshuflw(auVar43,auVar36,0xe8);
                          auVar27 = (auVar27 | auVar33 & auVar43) ^ _DAT_0023b0c0;
                          auVar27 = packssdw(auVar27,auVar27);
                          auVar27 = packsswb(auVar27,auVar27);
                          if ((auVar27 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                            pDVar13[-0xb].active = false;
                          }
                          auVar36 = auVar35 & auVar46 | auVar36;
                          auVar27 = packssdw(auVar36,auVar36);
                          auVar27 = packssdw(auVar27 ^ _DAT_0023b0c0,auVar27 ^ _DAT_0023b0c0);
                          auVar27 = packsswb(auVar27,auVar27);
                          if ((auVar27._4_2_ >> 8 & 1) != 0) {
                            pDVar13[-10].active = false;
                          }
                          auVar27 = (auVar29 | _DAT_0023b060) ^ _DAT_0023b0a0;
                          iVar52 = -(uint)(iVar9 < auVar27._0_4_);
                          auVar54._4_4_ = -(uint)(iVar30 < auVar27._4_4_);
                          iVar56 = -(uint)(iVar31 < auVar27._8_4_);
                          auVar54._12_4_ = -(uint)(iVar32 < auVar27._12_4_);
                          auVar57._4_4_ = iVar52;
                          auVar57._0_4_ = iVar52;
                          auVar57._8_4_ = iVar56;
                          auVar57._12_4_ = iVar56;
                          auVar47._4_4_ = -(uint)(auVar27._4_4_ == iVar30);
                          auVar47._12_4_ = -(uint)(auVar27._12_4_ == iVar32);
                          auVar47._0_4_ = auVar47._4_4_;
                          auVar47._8_4_ = auVar47._12_4_;
                          auVar54._0_4_ = auVar54._4_4_;
                          auVar54._8_4_ = auVar54._12_4_;
                          auVar27 = auVar47 & auVar57 | auVar54;
                          auVar27 = packssdw(auVar27,auVar27);
                          auVar27 = packssdw(auVar27 ^ _DAT_0023b0c0,auVar27 ^ _DAT_0023b0c0);
                          auVar27 = packsswb(auVar27,auVar27);
                          if ((auVar27 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0
                             ) {
                            pDVar13[-9].active = false;
                          }
                          auVar34 = pshufhw(auVar57,auVar57,0x84);
                          auVar57 = pshufhw(auVar47,auVar47,0x84);
                          auVar45 = pshufhw(auVar34,auVar54,0x84);
                          auVar34 = (auVar45 | auVar57 & auVar34) ^ _DAT_0023b0c0;
                          auVar34 = packssdw(auVar34,auVar34);
                          auVar34 = packsswb(auVar34,auVar34);
                          if ((auVar34._6_2_ >> 8 & 1) != 0) {
                            pDVar13[-8].active = false;
                          }
                          auVar34 = (auVar29 | _DAT_0023b050) ^ _DAT_0023b0a0;
                          iVar52 = -(uint)(iVar9 < auVar34._0_4_);
                          auVar38._4_4_ = -(uint)(iVar30 < auVar34._4_4_);
                          iVar56 = -(uint)(iVar31 < auVar34._8_4_);
                          auVar38._12_4_ = -(uint)(iVar32 < auVar34._12_4_);
                          auVar48._4_4_ = iVar52;
                          auVar48._0_4_ = iVar52;
                          auVar48._8_4_ = iVar56;
                          auVar48._12_4_ = iVar56;
                          auVar27 = pshuflw(auVar27,auVar48,0xe8);
                          auVar37._4_4_ = -(uint)(auVar34._4_4_ == iVar30);
                          auVar37._12_4_ = -(uint)(auVar34._12_4_ == iVar32);
                          auVar37._0_4_ = auVar37._4_4_;
                          auVar37._8_4_ = auVar37._12_4_;
                          auVar43 = pshuflw(auVar33 & auVar43,auVar37,0xe8);
                          auVar38._0_4_ = auVar38._4_4_;
                          auVar38._8_4_ = auVar38._12_4_;
                          auVar33 = pshuflw(auVar27,auVar38,0xe8);
                          auVar33 = (auVar33 | auVar43 & auVar27) ^ _DAT_0023b0c0;
                          auVar33 = packssdw(auVar33,auVar33);
                          auVar33 = packsswb(auVar33,auVar33);
                          if ((auVar33 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                            pDVar13[-7].active = false;
                          }
                          auVar38 = auVar37 & auVar48 | auVar38;
                          auVar33 = packssdw(auVar38,auVar38);
                          auVar33 = packssdw(auVar33 ^ _DAT_0023b0c0,auVar33 ^ _DAT_0023b0c0);
                          auVar33 = packsswb(auVar33,auVar33);
                          if ((auVar33._8_2_ >> 8 & 1) != 0) {
                            pDVar13[-6].active = false;
                          }
                          auVar33 = (auVar29 | _DAT_0023b040) ^ _DAT_0023b0a0;
                          iVar52 = -(uint)(iVar9 < auVar33._0_4_);
                          auVar55._4_4_ = -(uint)(iVar30 < auVar33._4_4_);
                          iVar56 = -(uint)(iVar31 < auVar33._8_4_);
                          auVar55._12_4_ = -(uint)(iVar32 < auVar33._12_4_);
                          auVar39._4_4_ = iVar52;
                          auVar39._0_4_ = iVar52;
                          auVar39._8_4_ = iVar56;
                          auVar39._12_4_ = iVar56;
                          auVar49._4_4_ = -(uint)(auVar33._4_4_ == iVar30);
                          auVar49._12_4_ = -(uint)(auVar33._12_4_ == iVar32);
                          auVar49._0_4_ = auVar49._4_4_;
                          auVar49._8_4_ = auVar49._12_4_;
                          auVar55._0_4_ = auVar55._4_4_;
                          auVar55._8_4_ = auVar55._12_4_;
                          auVar33 = auVar49 & auVar39 | auVar55;
                          auVar33 = packssdw(auVar33,auVar33);
                          auVar33 = packssdw(auVar33 ^ _DAT_0023b0c0,auVar33 ^ _DAT_0023b0c0);
                          auVar33 = packsswb(auVar33,auVar33);
                          if ((auVar33 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                            pDVar13[-5].active = false;
                          }
                          auVar34 = pshufhw(auVar39,auVar39,0x84);
                          auVar57 = pshufhw(auVar49,auVar49,0x84);
                          auVar45 = pshufhw(auVar34,auVar55,0x84);
                          auVar34 = (auVar45 | auVar57 & auVar34) ^ _DAT_0023b0c0;
                          auVar34 = packssdw(auVar34,auVar34);
                          auVar34 = packsswb(auVar34,auVar34);
                          if ((auVar34._10_2_ >> 8 & 1) != 0) {
                            pDVar13[-4].active = false;
                          }
                          auVar34 = (auVar29 | _DAT_0023b030) ^ _DAT_0023b0a0;
                          iVar52 = -(uint)(iVar9 < auVar34._0_4_);
                          auVar41._4_4_ = -(uint)(iVar30 < auVar34._4_4_);
                          iVar56 = -(uint)(iVar31 < auVar34._8_4_);
                          auVar41._12_4_ = -(uint)(iVar32 < auVar34._12_4_);
                          auVar50._4_4_ = iVar52;
                          auVar50._0_4_ = iVar52;
                          auVar50._8_4_ = iVar56;
                          auVar50._12_4_ = iVar56;
                          auVar33 = pshuflw(auVar33,auVar50,0xe8);
                          auVar40._4_4_ = -(uint)(auVar34._4_4_ == iVar30);
                          auVar40._12_4_ = -(uint)(auVar34._12_4_ == iVar32);
                          auVar40._0_4_ = auVar40._4_4_;
                          auVar40._8_4_ = auVar40._12_4_;
                          in_XMM7 = pshuflw(auVar43 & auVar27,auVar40,0xe8);
                          in_XMM7 = in_XMM7 & auVar33;
                          auVar41._0_4_ = auVar41._4_4_;
                          auVar41._8_4_ = auVar41._12_4_;
                          auVar27 = pshuflw(auVar33,auVar41,0xe8);
                          auVar27 = (auVar27 | in_XMM7) ^ _DAT_0023b0c0;
                          auVar27 = packssdw(auVar27,auVar27);
                          in_XMM6 = packsswb(auVar27,auVar27);
                          if ((in_XMM6 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                            pDVar13[-3].active = false;
                          }
                          auVar41 = auVar40 & auVar50 | auVar41;
                          auVar27 = packssdw(auVar41,auVar41);
                          auVar27 = packssdw(auVar27 ^ _DAT_0023b0c0,auVar27 ^ _DAT_0023b0c0);
                          auVar27 = packsswb(auVar27,auVar27);
                          if ((auVar27._12_2_ >> 8 & 1) != 0) {
                            pDVar13[-2].active = false;
                          }
                          auVar27 = (auVar29 | _DAT_0023b020) ^ _DAT_0023b0a0;
                          auVar51._0_4_ = -(uint)(iVar9 < auVar27._0_4_);
                          auVar51._4_4_ = -(uint)(iVar30 < auVar27._4_4_);
                          auVar51._8_4_ = -(uint)(iVar31 < auVar27._8_4_);
                          auVar51._12_4_ = -(uint)(iVar32 < auVar27._12_4_);
                          auVar42._4_4_ = auVar51._0_4_;
                          auVar42._0_4_ = auVar51._0_4_;
                          auVar42._8_4_ = auVar51._8_4_;
                          auVar42._12_4_ = auVar51._8_4_;
                          auVar26._4_4_ = -(uint)(auVar27._4_4_ == iVar30);
                          auVar26._12_4_ = -(uint)(auVar27._12_4_ == iVar32);
                          auVar26._0_4_ = auVar26._4_4_;
                          auVar26._8_4_ = auVar26._12_4_;
                          auVar28._4_4_ = auVar51._4_4_;
                          auVar28._0_4_ = auVar51._4_4_;
                          auVar28._8_4_ = auVar51._12_4_;
                          auVar28._12_4_ = auVar51._12_4_;
                          auVar27 = packssdw(auVar51,auVar26 & auVar42 | auVar28);
                          auVar27 = packssdw(auVar27 ^ _DAT_0023b0c0,auVar27 ^ _DAT_0023b0c0);
                          auVar27 = packsswb(auVar27,auVar27);
                          if ((auVar27 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0
                             ) {
                            pDVar13[-1].active = false;
                          }
                          auVar33 = pshufhw(auVar42,auVar42,0x84);
                          auVar27 = pshufhw(auVar26,auVar26,0x84);
                          auVar29 = pshufhw(auVar28,auVar28,0x84);
                          auVar27 = packssdw(auVar27 & auVar33,
                                             (auVar29 | auVar27 & auVar33) ^ _DAT_0023b0c0);
                          auVar27 = packsswb(auVar27,auVar27);
                          if ((auVar27._14_2_ >> 8 & 1) != 0) {
                            pDVar13->active = false;
                          }
                          piVar16 = piVar16 + 0x10;
                          pDVar13 = pDVar13 + 0x10;
                        } while ((istream *)((uVar23 >> 4) + 0x10 & 0xfffffffffffffff0) != piVar16);
                      }
                    }
                    else {
                      piVar16 = extraout_RDX_13;
                      if (3 < (int)Logger::logLevel) {
                        std::__cxx11::stringstream::stringstream((stringstream *)local_468);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_458._M_local_buf,"Line = ",7);
                        poVar10 = std::ostream::_M_insert<unsigned_long>
                                            ((ostream *)local_458._M_local_buf,(ulong)local_54c);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10," - filtered out by numeric filter",0x21);
                        std::endl<char,std::char_traits<char>>(poVar10);
                        Logger::log(__x);
                        std::__cxx11::stringbuf::str();
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (extraout_RAX_13,(char *)local_598._0_8_,local_598._8_8_);
                        goto LAB_0017da6e;
                      }
                    }
                  }
                  else {
                    piVar16 = extraout_RDX_12;
                    if (3 < (int)Logger::logLevel) {
                      std::__cxx11::stringstream::stringstream((stringstream *)local_468);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_458._M_local_buf,"Line = ",7);
                      poVar10 = std::ostream::_M_insert<unsigned_long>
                                          ((ostream *)local_458._M_local_buf,(ulong)local_54c);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10," - filtered out by string filter",0x20);
                      cVar7 = std::ios::widen((ios *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18))
                                              ,'\n');
                      poVar10 = (ostream *)std::ostream::put(poVar10,cVar7);
                      dVar24 = (double)std::ostream::flush(poVar10);
                      Logger::log(dVar24);
                      std::__cxx11::stringbuf::str();
                      std::__ostream_insert<char,std::char_traits<char>>
                                (extraout_RAX_12,(char *)local_598._0_8_,local_598._8_8_);
                      goto LAB_0017da6e;
                    }
                  }
                }
                else {
                  piVar16 = extraout_RDX_10;
                  if (4 < (int)Logger::logLevel) {
                    std::__cxx11::stringstream::stringstream((stringstream *)local_468);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_458._M_local_buf,"Row not sampled. Skipping",0x19);
                    cVar7 = std::ios::widen((ios *)(*(long *)(local_458._M_allocated_capacity - 0x18
                                                             ) + (long)&local_458),'\n');
                    poVar10 = (ostream *)std::ostream::put((ostream *)local_458._M_local_buf,cVar7);
                    dVar24 = (double)std::ostream::flush(poVar10);
                    Logger::log(dVar24);
                    std::__cxx11::stringbuf::str();
                    std::__ostream_insert<char,std::char_traits<char>>
                              (extraout_RAX_07,(char *)local_598._0_8_,local_598._8_8_);
LAB_0017da6e:
                    if ((pointer)local_598._0_8_ != (pointer)local_588) {
                      operator_delete((void *)local_598._0_8_,(ulong)(local_588._0_8_ + 1));
                    }
                    std::__cxx11::stringstream::~stringstream((stringstream *)local_468);
                    std::ios_base::~ios_base((ios_base *)local_588._16_8_);
                    piVar16 = extraout_RDX_08;
                  }
                }
              }
              else if (2 < (int)Logger::logLevel) {
                std::__cxx11::stringstream::stringstream((stringstream *)local_468);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_458._M_local_buf,"Skipping header line.",0x15);
                cVar7 = std::ios::widen((ios *)(*(long *)(local_458._M_allocated_capacity - 0x18) +
                                               (long)&local_458),'\n');
                poVar10 = (ostream *)std::ostream::put((ostream *)local_458._M_local_buf,cVar7);
                dVar24 = (double)std::ostream::flush(poVar10);
                Logger::log(dVar24);
                std::__cxx11::stringbuf::str();
                std::__ostream_insert<char,std::char_traits<char>>
                          (extraout_RAX_04,(char *)local_598._0_8_,local_598._8_8_);
                goto LAB_0017da6e;
              }
            }
LAB_0017daa9:
            bVar8 = false;
            uVar19 = 0;
            goto LAB_0017daac;
          }
        }
      }
      bVar8 = false;
    }
    else {
      bVar8 = true;
      if (4 < (int)Logger::logLevel) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_468);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_458._M_local_buf,"End of file found. Exiting.",0x1b);
        cVar7 = std::ios::widen((ios *)(*(long *)(local_458._M_allocated_capacity - 0x18) +
                                       (long)&local_458),'\n');
        poVar10 = (ostream *)std::ostream::put((ostream *)local_458._M_local_buf,cVar7);
        dVar24 = (double)std::ostream::flush(poVar10);
        Logger::log(dVar24);
        std::__cxx11::stringbuf::str();
        std::__ostream_insert<char,std::char_traits<char>>
                  (extraout_RAX_00,(char *)local_598._0_8_,local_598._8_8_);
LAB_0017d532:
        bVar8 = true;
        if ((pointer)local_598._0_8_ != (pointer)local_588) {
          operator_delete((void *)local_598._0_8_,(ulong)(local_588._0_8_ + 1));
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_468);
        std::ios_base::~ios_base((ios_base *)local_588._16_8_);
        piVar16 = extraout_RDX_01;
      }
    }
LAB_0017daac:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_538._M_dataplus._M_p != &local_538.field_2) {
      operator_delete(local_538._M_dataplus._M_p,
                      CONCAT44(local_538.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_538.field_2._M_local_buf[3],
                                        CONCAT12(local_538.field_2._M_local_buf[2],
                                                 CONCAT11(local_538.field_2._M_local_buf[1],
                                                          local_538.field_2._M_local_buf[0])))) + 1)
      ;
      piVar16 = extraout_RDX_09;
    }
  } while (!bVar8);
  sVar17 = (size_type)local_53c;
  if ((long)(local_4e8._8_8_ - local_4e8._0_8_) >> 5 != sVar17) {
    if (((local_548->_options).headerRow != 0) && (0 < (int)Logger::logLevel)) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_468);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_458._M_local_buf,
                 "Size of header titles does not match data dimensions so using indices as header titles."
                 ,0x57);
      cVar7 = std::ios::widen((ios *)((long)&local_458 +
                                     *(long *)(local_458._M_allocated_capacity - 0x18)),'\n');
      poVar10 = (ostream *)std::ostream::put((ostream *)local_458._M_local_buf,cVar7);
      dVar24 = (double)std::ostream::flush(poVar10);
      Logger::log(dVar24);
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>
                (extraout_RAX_14,local_538._M_dataplus._M_p,local_538._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_538._M_dataplus._M_p != &local_538.field_2) {
        operator_delete(local_538._M_dataplus._M_p,
                        CONCAT44(local_538.field_2._M_allocated_capacity._4_4_,
                                 CONCAT13(local_538.field_2._M_local_buf[3],
                                          CONCAT12(local_538.field_2._M_local_buf[2],
                                                   CONCAT11(local_538.field_2._M_local_buf[1],
                                                            local_538.field_2._M_local_buf[0])))) +
                        1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_468);
      std::ios_base::~ios_base(local_3e8);
    }
    local_468._0_8_ = &local_458;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_4e8,sVar17,(value_type *)local_468);
    iVar9 = local_53c;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._0_8_ != &local_458) {
      operator_delete((void *)local_468._0_8_,local_458._M_allocated_capacity + 1);
    }
    if (iVar9 < 1) goto LAB_0017ef56;
    lVar22 = 0;
    uVar23 = 0;
    do {
      sVar1 = uVar23 + 1;
      local_598._0_8_ = (_Bit_type *)(double)(long)sVar1;
      local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
      if (NAN((double)(long)sVar1)) {
        local_538.field_2._M_local_buf[2] = 'n';
        local_538.field_2._M_local_buf[0] = 'n';
        local_538.field_2._M_local_buf[1] = 'a';
        local_538._M_string_length = 3;
        local_538.field_2._M_local_buf[3] = '\0';
      }
      else {
        local_538._M_string_length = 0;
        local_538.field_2._M_local_buf[0] = '\0';
        std::__cxx11::stringstream::stringstream((stringstream *)local_468);
        *(uint *)((long)auStack_440 + *(long *)(local_458._M_allocated_capacity - 0x18)) =
             *(uint *)((long)auStack_440 + *(long *)(local_458._M_allocated_capacity - 0x18)) &
             0xfffffefb | 4;
        std::ostream::_M_insert<long>((ostream *)local_458._M_local_buf,sVar1);
        std::operator>>((istream *)local_468,(string *)&local_538);
        std::__cxx11::stringstream::~stringstream((stringstream *)local_468);
        std::ios_base::~ios_base(local_3e8);
      }
      if ((ulong)((long)(local_4e8._8_8_ - local_4e8._0_8_) >> 5) <= uVar23) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar23);
      }
      std::__cxx11::string::operator=
                ((string *)((long)&((_Alloc_hider *)local_4e8._0_8_)->_M_p + lVar22),
                 (string *)&local_538);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_538._M_dataplus._M_p != &local_538.field_2) {
        operator_delete(local_538._M_dataplus._M_p,
                        CONCAT44(local_538.field_2._M_allocated_capacity._4_4_,
                                 CONCAT13(local_538.field_2._M_local_buf[3],
                                          CONCAT12(local_538.field_2._M_local_buf[2],
                                                   CONCAT11(local_538.field_2._M_local_buf[1],
                                                            local_538.field_2._M_local_buf[0])))) +
                        1);
      }
      lVar22 = lVar22 + 0x20;
      uVar23 = sVar1;
    } while (sVar17 != sVar1);
  }
  if (0 < local_53c) {
    lVar21 = 8;
    lVar22 = 0xa8;
    uVar23 = 0;
    do {
      lVar14 = (long)(local_548->_tracker)._statistics.
                     super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(local_548->_tracker)._statistics.
                     super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3;
      if (SBORROW8(uVar23,lVar14 * 0x34f72c234f72c235) ==
          (long)(uVar23 + lVar14 * -0x34f72c234f72c235) < 0) break;
      if ((ulong)((long)(local_4e8._8_8_ - local_4e8._0_8_) >> 5) <= uVar23) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar23);
      }
      lVar14 = *(long *)(local_4e8._0_8_ + lVar21 + -8);
      local_258[0] = local_248;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_258,lVar14,
                 *(long *)((long)&((_Alloc_hider *)local_4e8._0_8_)->_M_p + lVar21) + lVar14);
      std::__cxx11::string::_M_assign
                ((string *)
                 ((long)&((local_548->_tracker)._statistics.
                          super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>.
                          _M_impl.super__Vector_impl_data._M_start)->_count + lVar22),
                 (string *)local_258);
      if (local_258[0] != local_248) {
        operator_delete(local_258[0],local_248[0] + 1);
      }
      uVar23 = uVar23 + 1;
      lVar21 = lVar21 + 0x20;
      lVar22 = lVar22 + 0xe8;
    } while (sVar17 != uVar23);
  }
LAB_0017ef56:
  if (2 < (int)Logger::logLevel) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_468);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_458._M_local_buf,
                         ApplicationProperties::NAME_abi_cxx11_._M_dataplus._M_p,
                         ApplicationProperties::NAME_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," is complete",0xc);
    cVar7 = std::ios::widen((ios *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18)),'\n');
    poVar10 = (ostream *)std::ostream::put(poVar10,cVar7);
    dVar24 = (double)std::ostream::flush(poVar10);
    Logger::log(dVar24);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              (extraout_RAX_15,local_538._M_dataplus._M_p,local_538._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_538._M_dataplus._M_p != &local_538.field_2) {
      operator_delete(local_538._M_dataplus._M_p,
                      CONCAT44(local_538.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_538.field_2._M_local_buf[3],
                                        CONCAT12(local_538.field_2._M_local_buf[2],
                                                 CONCAT11(local_538.field_2._M_local_buf[1],
                                                          local_538.field_2._M_local_buf[0])))) + 1)
      ;
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_468);
    std::ios_base::~ios_base(local_3e8);
  }
  if ((pointer)local_488._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_488._0_8_,(long)local_478 - local_488._0_8_);
  }
  if (local_508.super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_508.super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_508.super__Vector_base<DataPoint,_std::allocator<DataPoint>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_508.super__Vector_base<DataPoint,_std::allocator<DataPoint>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((long *)local_588._24_8_ != local_560) {
    operator_delete((void *)local_588._24_8_,local_560[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_4c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_4e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._comment._M_dataplus._M_p != &local_4a8._comment.field_2) {
    operator_delete(local_4a8._comment._M_dataplus._M_p,
                    local_4a8._comment.field_2._M_allocated_capacity + 1);
  }
  std::ifstream::~ifstream((ifstream *)&stack0xfffffffffffffdc8);
  return 0;
}

Assistant:

int
    run(void)
    {

        // ==================================================
        // Application parameters
        // --------------------------------------------------
        int numDim = 0;
        int numDimMask = 0;

        // ==================================================
        // Define input stream
        // --------------------------------------------------
        std::ifstream fileInput(this->_options.fileInput.c_str(), std::ios::in);
        std::istream * source = (fileInput.good() ? &fileInput : &std::cin);

        LOG_MESSAGE(Logger::Level::INFO, ApplicationProperties::NAME << " is starting");

        // ==================================================
        // Define output writer
        // --------------------------------------------------
        StatisticsWriter writer;

        // ==================================================
        // Define row sampler
        // --------------------------------------------------
        RowSampler sampler(this->_options.sampling);

        // ==================================================
        // Loop through source data
        // --------------------------------------------------
        
        // titles is populated by parsed line if user provides a titles row, otherwise indices are used
        std::vector<std::string> titles;
        StringSplitter parser;
        
        // Counters used to keep track of line reads if reshaping is requested by user
        unsigned int counter = 0;
        unsigned int counterSinceLastParsing = 0;
        std::string lineToReshape = "";
        
        // DataVector contains the parsed data from each line.
        // It's size will get set on the first successful parsing.
        DataVector data;
        DataVector dataMasked;
        
        bool reading = true;
        while (reading)
        {

            // ==================================================
            // Extract current line
            // --------------------------------------------------
            std::string line = StatisticsApp::readline(*source);
            if (!(*source).good())
            {
                LOG_MESSAGE(Logger::Level::DETAIL, "End of file found. Exiting.");
                break;
            }

            // ==================================================
            // Check if line is empty and if we need to exit
            // --------------------------------------------------
            if (line.size() == 0)
            {
                if (this->_options.blankEOF)
                {
                    LOG_MESSAGE(Logger::Level::DETAIL, "Blank line found. Exiting.");
                    break;
                }
                else
                {
                    LOG_MESSAGE(Logger::Level::DETAIL, "Blank line found. Skipping.");
                    continue;
                }
            }
            
            // ==================================================
            // Check if row is comment and needs to be skipped
            // --------------------------------------------------
            if (line.compare(0,1,this->_options.comment.c_str()) == 0) continue;
            
            // ==================================================
            // Check if row needs to be reshaped into column
            // --------------------------------------------------

            // If yes, then append current line to previous
            // lines with delimiter and continue to next read
            counterSinceLastParsing++;
            lineToReshape += (counterSinceLastParsing == 1 ? "" : this->_options.delimiter) + line;
            if (counterSinceLastParsing < this->_options.numLinesToReshape) continue;

            // Prepare line and counter for parsing
            line = lineToReshape;
            counter++;

            // Reset counter and appended line for next read
            counterSinceLastParsing = 0;
            lineToReshape = "";

            // ==================================================
            // Extract header titles
            // --------------------------------------------------
            if (this->_options.headerRow == counter)
            {
                parser.initialize(line, this->_options.delimiter, this->_options.removeDuplicates, this->_options.filterColumns);
                titles = parser.tokens();
                continue;
            }
            
            // ==================================================
            // Skip header rows
            // --------------------------------------------------
            if (counter <= this->_options.numLinesToSkip)
            {
                LOG_MESSAGE(Logger::Level::INFO, "Skipping header line.");
                continue;
            }

            // ==================================================
            // Skip unneeded rows
            // --------------------------------------------------
            if (counter > (this->_options.numLinesToSkip + this->_options.numLinesToKeep))
            {
                LOG_MESSAGE(Logger::Level::INFO, "Skipping remaining lines.");
                break;
            }

            // ==================================================
            // Skip unsampled rows
            // --------------------------------------------------
            if (!sampler.sample())
            {
                LOG_MESSAGE(Logger::Level::DETAIL, "Row not sampled. Skipping");
                continue;
            }

            // ==================================================
            // Parse current line
            // --------------------------------------------------
            parser.initialize(line, this->_options.delimiter, this->_options.removeDuplicates);
            StringSplitter::size_type numTokens = parser.size();
            LOG_MESSAGE(Logger::Level::DETAIL, "Line = " << counter << " - content =\"" << line << "\"");

            // ==================================================
            // Check and compute source data dimensions
            // --------------------------------------------------
            bool isDimSet = numDim > 0;
            if (!isDimSet)
            {
                numDim = (int) numTokens;
                data.resize(numDim);

                // Make sure we only keep column filters if they are within actual number of columns
                this->_options.filterColumns.resize(numDim, (this->_options.filterColumns.size() == 0));

                // Compute how many columns are masked out
                numDimMask = std::accumulate(this->_options.filterColumns.begin(), this->_options.filterColumns.end(), 0);
                dataMasked.resize(numDimMask);

                LOG_MESSAGE(Logger::Level::INFO, "Data dimensions set to " << numDim);
                LOG_MESSAGE(Logger::Level::INFO, "Mask dimensions set to " << numDimMask);
            }

            bool isDimFailed = (numDim != (int) numTokens);
            if (isDimFailed)
            {
                LOG_MESSAGE(Logger::Level::WARNING, "Line = " << counter << " - Statistics dimensions does not equal data dimensions." << (this->_options.strictParsing ? " Skipping." : ""));
                if (this->_options.strictParsing)
                {
                    continue;
                }
            }

            LOG_MESSAGE(Logger::Level::DEBUG, "Line = " << counter << " - Number of tokens found: " << numTokens);

            // ==================================================
            // Apply string filters
            // --------------------------------------------------
            bool isStringFiltered = this->_options.filterRows.isFiltered(parser.get());
            if (!isStringFiltered)
            {
                LOG_MESSAGE(Logger::Level::DEBUG, "Line = " << counter << " - filtered out by string filter");
                continue;
            }

            // ==================================================
            // Convert tokens into data array
            // --------------------------------------------------
            for (StringSplitter::size_type i = 0; i < (StringSplitter::size_type) numDim; ++i)
            {

                if (numTokens <= i) break;

                data.at(i).active = parser.toValue<double>(i, data.at(i).value);

                LOG_MESSAGE(Logger::Level::DETAIL, "Line = " << counter << " - " << (data.at(i).active ? "Valid token" : "Invalid token") << " = " << parser.at(i));

            }

            // ==================================================
            // Apply numeric filters
            // --------------------------------------------------
            bool isNumericFiltered = this->_options.filterRows.isFiltered(data);
            if (!isNumericFiltered)
            {
                LOG_MESSAGE(Logger::Level::DEBUG, "Line = " << counter << " - filtered out by numeric filter");
                continue;
            }

            // ==================================================
            // Apply column filters
            // --------------------------------------------------
            DataVector::copy(data, numDim, dataMasked, numDimMask, this->_options.filterColumns, numDim);

            // ==================================================
            // Write current data
            // --------------------------------------------------
            if (this->_options.showFilteredData)
            {
                writer.writeData(*this->_outputStream, dataMasked);
            }

            // ==================================================
            // Update statistics with current data
            // --------------------------------------------------
            this->_tracker.update(dataMasked);

            // Since the data vector is preallocated, we deactivate all entries in case they don't exist in the next parsed line
            // This way they don't get inadvertently included in the next line's statistics
            data.deactivate();

        }

        // ==================================================
        // Update statistics names
        // --------------------------------------------------
        if (numDimMask != (long)titles.size())
        {
            // Show error message if user provided a bad header row
            if (this->_options.headerRow > 0)
            {
                LOG_MESSAGE(Logger::Level::ERROR, "Size of header titles does not match data dimensions so using indices as header titles.");
            }
            titles.resize(numDimMask,"");
            for (long i = 0; i < numDimMask; i++)
            {
                titles.at(i) = StringParser::parseNumber<long>(i+1);
            }
        }
        for (long i = 0; i < numDimMask && i < this->_tracker.getDimension(); i++)
        {
            this->_tracker.setName(i, titles.at(i));
        }

        LOG_MESSAGE(Logger::Level::INFO, ApplicationProperties::NAME << " is complete");
    
        return 0;
        
    }